

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_message_digester.hxx
# Opt level: O0

void __thiscall
cryptox::
evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md4,_128UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
::evp_message_digest_context
          (evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md4,_128UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
           *this)

{
  EVP_MD_CTX *ctx;
  int iVar1;
  EVP_MD_CTX *pEVar2;
  EVP_MD *type;
  source_location local_60;
  evp_error local_48;
  evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md4,_128UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
  *local_10;
  evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md4,_128UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
  *this_local;
  
  local_10 = this;
  pEVar2 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  this->_context = pEVar2;
  ctx = (EVP_MD_CTX *)this->_context;
  type = (EVP_MD *)message_digest_algorithm<&EVP_md4,_128UL>::digest();
  iVar1 = EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
  if (iVar1 == 0) {
    local_48._32_8_ = 0;
    local_48._40_8_ = 0;
    local_48._16_8_ = 0;
    local_48._24_8_ = 0;
    local_48._0_8_ = 0;
    local_48._8_8_ = 0;
    evp_error::evp_error(&local_48);
    boost::source_location::source_location
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/include/cryptox/message_digests/basic_message_digester.hxx"
               ,0x23,
               "cryptox::evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md4, 128>, &EVP_DigestInit_ex, &EVP_DigestUpdate, &EVP_DigestFinal_ex>::evp_message_digest_context() [Algorithm = cryptox::message_digest_algorithm<&EVP_md4, 128>, InitFx = &EVP_DigestInit_ex, UpdateFx = &EVP_DigestUpdate, FinalFx = &EVP_DigestFinal_ex]"
               ,0);
    boost::throw_exception<cryptox::evp_error>(&local_48,&local_60);
  }
  return;
}

Assistant:

evp_message_digest_context() {
			_context = EVP_MD_CTX_new();

			if (InitFx(_context, Algorithm::digest(), NULL) == 0)
				BOOST_THROW_EXCEPTION(evp_error());
		}